

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

String * __thiscall
capnp::anon_unknown_79::Parser::consumeNumber(String *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  char *value;
  size_t size;
  Fault local_78;
  Fault f;
  size_t local_68;
  DebugExpression<unsigned_long> local_60;
  undefined1 local_58 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  undefined1 local_28 [8];
  ArrayPtr<const_char> numArrayPtr;
  Parser *this_local;
  
  numArrayPtr.size_ = (size_t)this;
  _local_28 = (anonymous_namespace)::Input::
              consumeCustom<capnp::(anonymous_namespace)::Parser::consumeNumber()::_lambda(capnp::(anonymous_namespace)::Input&)_1_>
                        ((Input *)&this->input,(anon_class_1_0_00000001 *)&_kjCondition.field_0x27);
  local_68 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_28);
  local_60 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_68);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_58,&local_60,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[31]>
              (&local_78,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x33d,FAILED,"numArrayPtr.size() > 0",
               "_kjCondition,\"Expected number in JSON input.\"",
               (DebugComparison<unsigned_long,_int> *)local_58,
               (char (*) [31])"Expected number in JSON input.");
    kj::_::Debug::Fault::fatal(&local_78);
  }
  value = kj::ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)local_28);
  size = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)local_28);
  kj::heapString(__return_storage_ptr__,value,size);
  return __return_storage_ptr__;
}

Assistant:

kj::String consumeNumber() {
    auto numArrayPtr = input.consumeCustom([](Input& input) {
      input.tryConsume('-');
      if (!input.tryConsume('0')) {
        input.consumeOne([](char c) { return '1' <= c && c <= '9'; });
        input.consumeWhile([](char c) { return '0' <= c && c <= '9'; });
      }

      if (input.tryConsume('.')) {
        input.consumeWhile([](char c) { return '0' <= c && c <= '9'; });
      }

      if (input.tryConsume('e') || input.tryConsume('E')) {
        input.tryConsume('+') || input.tryConsume('-');
        input.consumeWhile([](char c) { return '0' <= c && c <= '9'; });
      }
    });

    KJ_REQUIRE(numArrayPtr.size() > 0, "Expected number in JSON input.");

    return kj::heapString(numArrayPtr.begin(), numArrayPtr.size());
    // TODO(perf): parse double here directly to avoid memory allocation
  }